

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

ParameterInfo * __thiscall
C3DFile::readParameterInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,ifstream *datastream)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  Uint8 *pUVar3;
  Sint16 *pSVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  int local_3c;
  int local_38;
  int count;
  int i;
  ifstream *datastream_local;
  C3DFile *this_local;
  ParameterInfo *result;
  
  ParameterInfo::ParameterInfo(__return_storage_ptr__);
  std::istream::read((char *)datastream,(long)__return_storage_ptr__);
  if (__return_storage_ptr__->name != (char *)0x0) {
    __assert_fail("result.name == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xdc,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  if (__return_storage_ptr__->name_length < '\0') {
    __return_storage_ptr__->name_length = -__return_storage_ptr__->name_length;
    __return_storage_ptr__->locked = true;
  }
  else {
    __return_storage_ptr__->locked = false;
  }
  pcVar2 = (char *)operator_new__((long)(__return_storage_ptr__->name_length + 1));
  __return_storage_ptr__->name = pcVar2;
  std::istream::read((char *)datastream,(long)__return_storage_ptr__->name);
  __return_storage_ptr__->name[__return_storage_ptr__->name_length] = '\0';
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->next_offset);
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->data_type);
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->n_dimensions);
  if ((1 < __return_storage_ptr__->n_dimensions) && (7 < __return_storage_ptr__->n_dimensions)) {
    __assert_fail("result.n_dimensions <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xed,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pUVar3 = (Uint8 *)operator_new__((ulong)__return_storage_ptr__->n_dimensions);
  __return_storage_ptr__->dimensions = pUVar3;
  if (__return_storage_ptr__->n_dimensions == '\0') {
    if ((__return_storage_ptr__->data_type == '\x01') || (__return_storage_ptr__->data_type == -1))
    {
      pcVar2 = (char *)operator_new__(1);
      __return_storage_ptr__->char_data = pcVar2;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->char_data);
    }
    else if (__return_storage_ptr__->data_type == '\x02') {
      pSVar4 = (Sint16 *)operator_new__(2);
      __return_storage_ptr__->int_data = pSVar4;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->int_data);
    }
    else if (__return_storage_ptr__->data_type == '\x04') {
      pfVar5 = (float *)operator_new__(4);
      __return_storage_ptr__->float_data = pfVar5;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->float_data);
    }
  }
  else {
    local_3c = 1;
    for (local_38 = 0; local_38 < (int)(uint)__return_storage_ptr__->n_dimensions;
        local_38 = local_38 + 1) {
      std::istream::read((char *)datastream,(long)(__return_storage_ptr__->dimensions + local_38));
      local_3c = (uint)__return_storage_ptr__->dimensions[local_38] * local_3c;
    }
    if ((__return_storage_ptr__->data_type == '\x01') || (__return_storage_ptr__->data_type == -1))
    {
      pcVar2 = (char *)operator_new__((long)local_3c);
      __return_storage_ptr__->char_data = pcVar2;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->char_data);
    }
    else if (__return_storage_ptr__->data_type == '\x02') {
      uVar6 = (ulong)local_3c;
      uVar7 = uVar6 * 2;
      if (CARRY8(uVar6,uVar6)) {
        uVar7 = 0xffffffffffffffff;
      }
      pSVar4 = (Sint16 *)operator_new__(uVar7);
      __return_storage_ptr__->int_data = pSVar4;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->int_data);
    }
    else if (__return_storage_ptr__->data_type == '\x04') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)local_3c;
      uVar7 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pfVar5 = (float *)operator_new__(uVar7);
      __return_storage_ptr__->float_data = pfVar5;
      std::istream::read((char *)datastream,(long)__return_storage_ptr__->float_data);
    }
  }
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->descr_length);
  if (__return_storage_ptr__->description == (char *)0x0) {
    pcVar2 = (char *)operator_new__((long)(__return_storage_ptr__->descr_length + 1));
    __return_storage_ptr__->description = pcVar2;
    std::istream::read((char *)datastream,(long)__return_storage_ptr__->description);
    __return_storage_ptr__->description[__return_storage_ptr__->descr_length] = '\0';
    return __return_storage_ptr__;
  }
  __assert_fail("result.description == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x117,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
}

Assistant:

ParameterInfo C3DFile::readParameterInfo (ifstream &datastream) {
	ParameterInfo result;
	datastream.read(reinterpret_cast<char *>(&result), sizeof(Sint8) * 2);
	
	assert(result.name == NULL);
	if (result.name_length < 0) {
		result.name_length *= -1;
		result.locked = true;
	} else {
		result.locked = false;
	}
	result.name = new char[result.name_length + 1];
	datastream.read(result.name, result.name_length);
	result.name[result.name_length] = 0;

	datastream.read(reinterpret_cast<char *>(&result.next_offset), sizeof(Sint16));
	datastream.read(reinterpret_cast<char *>(&result.data_type), sizeof(Uint8));
	datastream.read(reinterpret_cast<char *>(&result.n_dimensions), sizeof(Uint8));

	if (result.n_dimensions > 1) {
		// maximum of 7 dimensions (see c3d UG p. 50)
		assert (result.n_dimensions <= 7);
	}

	result.dimensions = new Uint8[result.n_dimensions];

	int i;

	if (result.n_dimensions == 0) {
		// if dim == 0 the data comes right away
		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[1];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char));
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[1];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16));
		} else if (result.data_type == 4) {
			result.float_data = new float[1];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float));
		}
	} else {
		// we first have to read out the dimensions of the values and then we can
		// store the values
		int count = 1;
		for (i = 0; i < result.n_dimensions; i++) {
			datastream.read(reinterpret_cast<char *>(&result.dimensions[i]), sizeof(Uint8));
			count *= result.dimensions[i];
		}

		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[count];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char) * count);
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[count];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16) * count);
		} else if (result.data_type == 4) {
			result.float_data = new float[count];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float) * count);
		}
	}

	datastream.read(reinterpret_cast<char *>(&result.descr_length), sizeof(Uint8));

	assert(result.description == NULL);
	result.description = new char[result.descr_length + 1];
	datastream.read(result.description, result.descr_length);
	result.description[result.descr_length] = 0;

	return result;
}